

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

void crnlib::rg_etc1::pack_etc1_block_init(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int local_c0;
  int v_1;
  int i_1;
  int i;
  uint expand5 [32];
  uint err;
  int v;
  uint packed_c;
  uint best_packed_c;
  uint best_error;
  int color;
  uint inverse_table_index;
  uint selector;
  uint inten;
  uint limit;
  uint diff;
  
  inten = 0;
  do {
    if (1 < inten) {
      for (v_1 = 0; v_1 < 0x20; v_1 = v_1 + 1) {
        (&i_1)[v_1] = v_1 << 3 | v_1 >> 2;
      }
      for (local_c0 = 0; local_c0 < 0x110; local_c0 = local_c0 + 1) {
        iVar3 = clamp<int>(local_c0 + -8,0,0xff);
        iVar3 = mul_8bit(iVar3,0x1f);
        g_quant5_tab[local_c0] = (char)(&i_1)[iVar3];
      }
      return;
    }
    uVar1 = 0x10;
    if (inten != 0) {
      uVar1 = 0x20;
    }
    for (inverse_table_index = 0; inverse_table_index < 8;
        inverse_table_index = inverse_table_index + 1) {
      for (color = 0; (uint)color < 4; color = color + 1) {
        for (best_packed_c = 0; (int)best_packed_c < 0x100; best_packed_c = best_packed_c + 1) {
          packed_c = 0xffffffff;
          v = 0;
          for (err = 0; err < uVar1; err = err + 1) {
            uVar2 = etc1_decode_value(inten,inverse_table_index,color,err);
            expand5[0x1f] = uVar2 - best_packed_c;
            if ((int)expand5[0x1f] < 1) {
              expand5[0x1f] = -expand5[0x1f];
            }
            iVar3 = v;
            if (expand5[0x1f] < packed_c) {
              v = err;
              iVar3 = v;
              v._0_2_ = (ushort)err;
              packed_c = expand5[0x1f];
              if (expand5[0x1f] == 0) break;
            }
            v = iVar3;
          }
          *(ushort *)
           (g_etc1_inverse_lookup +
           (long)(int)best_packed_c * 2 +
           (ulong)(inten + inverse_table_index * 2 + color * 0x10) * 0x200) =
               (ushort)v | (ushort)(packed_c << 8);
        }
      }
    }
    inten = inten + 1;
  } while( true );
}

Assistant:

void pack_etc1_block_init()
        {
            for (uint diff = 0; diff < 2; diff++)
            {
                const uint limit = diff ? 32 : 16;

                for (uint inten = 0; inten < 8; inten++)
                {
                    for (uint selector = 0; selector < 4; selector++)
                    {
                        const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
                        for (int color = 0; color < 256; color++)
                        {
                            uint best_error = cUINT32_MAX, best_packed_c = 0;
                            for (uint packed_c = 0; packed_c < limit; packed_c++)
                            {
                                int v = etc1_decode_value(diff, inten, selector, packed_c);
                                uint err = labs(v - color);
                                if (err < best_error)
                                {
                                    best_error = err;
                                    best_packed_c = packed_c;
                                    if (!best_error)
                                    {
                                        break;
                                    }
                                }
                            }
                            RG_ETC1_ASSERT(best_error <= 255);
                            g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
                        }
                    }
                }
            }

            uint expand5[32];
            for (int i = 0; i < 32; i++)
            {
                expand5[i] = (i << 3) | (i >> 2);
            }

            for (int i = 0; i < 256 + 16; i++)
            {
                int v = clamp<int>(i - 8, 0, 255);
                g_quant5_tab[i] = static_cast<uint8>(expand5[mul_8bit(v, 31)]);
            }
        }